

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::ListDatatypeValidator::valueSpaceCheck
          (ListDatatypeValidator *this,BaseRefVectorOf<char16_t> *tokenVector,XMLCh *enumStr,
          MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  BaseRefVectorOf<char16_t> *this_00;
  char16_t *pcVar3;
  char16_t *pcVar4;
  XMLSize_t getAt;
  ulong uVar5;
  bool bVar6;
  
  do {
    this = (ListDatatypeValidator *)
           (this->super_AbstractStringValidator).super_DatatypeValidator.fBaseValidator;
  } while ((this->super_AbstractStringValidator).super_DatatypeValidator.fType == List);
  this_00 = XMLString::tokenizeString(enumStr,manager);
  if (tokenVector->fCurCount == this_00->fCurCount) {
    if (tokenVector->fCurCount == 0) {
      bVar6 = true;
    }
    else {
      getAt = 0;
      uVar5 = 1;
      do {
        pcVar3 = BaseRefVectorOf<char16_t>::elementAt(tokenVector,getAt);
        pcVar4 = BaseRefVectorOf<char16_t>::elementAt(this_00,getAt);
        iVar2 = (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
                  _vptr_XSerializable[10])(this,pcVar3,pcVar4,manager);
        bVar6 = iVar2 == 0;
        if (!bVar6) break;
        bVar1 = uVar5 < tokenVector->fCurCount;
        getAt = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar1);
    }
  }
  else {
    bVar6 = false;
  }
  (*this_00->_vptr_BaseRefVectorOf[1])(this_00);
  return bVar6;
}

Assistant:

bool ListDatatypeValidator::valueSpaceCheck(BaseRefVectorOf<XMLCh>* tokenVector
                                          , const XMLCh*    const  enumStr
                                          , MemoryManager*  const  manager) const
{
    DatatypeValidator* theItemTypeDTV = getItemTypeDTV();
    BaseRefVectorOf<XMLCh>* enumVector = XMLString::tokenizeString(enumStr, manager);
    Janitor<BaseRefVectorOf<XMLCh> > janName(enumVector);

    if (tokenVector->size() != enumVector->size())
        return false;

    for ( unsigned int j = 0; j < tokenVector->size(); j++ )
    {
        if (theItemTypeDTV->compare(tokenVector->elementAt(j), enumVector->elementAt(j), manager) != 0)
            return false;
    }

    return true;
}